

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parent.cpp
# Opt level: O0

string * fs_parent_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  bool bVar1;
  _Bool _Var2;
  bool bVar3;
  __sv_type path_00;
  __type local_16a;
  string local_120;
  undefined4 local_100;
  allocator<char> local_f9;
  path local_f8;
  path local_d0;
  string local_a8;
  __sv_type local_88;
  string local_78;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string p;
  string_view path_local;
  
  p.field_2._8_8_ = path._M_len;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_40,
             (basic_string_view<char,_std::char_traits<char>_> *)((long)&p.field_2 + 8),&local_41);
  std::allocator<char>::~allocator(&local_41);
  local_88 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
  fs_drop_slash_abi_cxx11_(&local_78,local_88);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,&local_78
            );
  std::__cxx11::string::~string((string *)&local_78);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
             ,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::generic_string(&local_a8,&local_d0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,&local_a8
            );
  std::__cxx11::string::~string((string *)&local_a8);
  std::filesystem::__cxx11::path::~path(&local_d0);
  std::filesystem::__cxx11::path::~path(&local_f8);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,".",&local_f9);
    std::allocator<char>::~allocator(&local_f9);
  }
  else {
    bVar1 = false;
    _Var2 = fs_is_windows();
    local_16a = false;
    if (_Var2) {
      bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
      local_16a = false;
      if (!bVar3) {
        path_00 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
        fs_root_name_abi_cxx11_(&local_120,path_00);
        bVar1 = true;
        local_16a = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,&local_120);
      }
    }
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_120);
    }
    if (local_16a != false) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,'/');
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
  }
  local_100 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_parent(std::string_view path)
{

  std::string p(path);

#ifdef HAVE_CXX_FILESYSTEM
  p = fs_drop_slash(p);
  // have to drop trailing slash to get expected parent path -- necessary for AppleClang
  p = std::filesystem::path(p).parent_path().generic_string();

  if(fs_trace) std::cout << "TRACE:parent(" << path << ") => " << p << "\n";

// 30.10.7.1 [fs.path.generic] dot-dot in the root-directory refers to the root-directory itself.
// On Windows, a drive specifier such as "C:" or "z:" is treated as a root-name.
// On Cygwin, a path that begins with two successive directory separators is a root-name.
// Otherwise (for POSIX-like systems other than Cygwin), the implementation-defined root-name
// is an unspecified string which does not appear in any pathnames.

#elif defined(_WIN32)
  p = fs_drop_slash(p);
  std::string dir(_MAX_DIR, '\0');
  std::string drive(_MAX_DRIVE, '\0');
  if(_splitpath_s(p.data(), drive.data(), _MAX_DRIVE, dir.data(), _MAX_DIR, nullptr, 0, nullptr, 0) != 0)
    return {};

  p = fs_drop_slash(fs_trim(drive) + fs_trim(dir));
#else
  char* d = dirname(p.data());
  return d ? d : "";
#endif

  if (p.empty())
    return ".";

  // need this for <filesystem> or _splitpath_s to make x: x:/
  if (fs_is_windows() && !p.empty() && p == fs_root_name(p))
    p.push_back('/');

  return p;
}